

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  secp256k1_fe *psVar1;
  uint64_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  uint64_t uVar175;
  uint64_t uVar176;
  int iVar177;
  ulong uVar178;
  undefined4 in_register_0000000c;
  secp256k1_gej *a;
  ulong uVar179;
  secp256k1_ge *a_00;
  uint64_t uVar180;
  secp256k1_ge *unaff_RBX;
  ulong uVar181;
  ulong uVar182;
  ulong uVar183;
  ulong uVar184;
  secp256k1_gej *r_00;
  secp256k1_gej *a_01;
  ulong uVar185;
  ulong uVar186;
  ulong uVar187;
  ulong uVar188;
  long lVar189;
  undefined1 auStack_270 [56];
  uint64_t uStack_238;
  uint64_t uStack_230;
  uint64_t uStack_228;
  uint64_t uStack_220;
  int iStack_218;
  undefined1 auStack_210 [56];
  uint64_t uStack_1d8;
  uint64_t uStack_1d0;
  uint64_t uStack_1c8;
  uint64_t uStack_1c0;
  int iStack_1b8;
  int iStack_1b4;
  ulong uStack_1b0;
  ulong uStack_1a8;
  undefined1 auStack_1a0 [152];
  uint64_t uStack_108;
  uint64_t uStack_100;
  uint64_t uStack_f8;
  ulong uStack_f0;
  undefined8 uStack_e8;
  secp256k1_fe sStack_e0;
  secp256k1_fe sStack_b0;
  ulong uStack_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  uint64_t uStack_60;
  int iStack_58;
  int iStack_54;
  secp256k1_ge *psStack_48;
  
  a = (secp256k1_gej *)CONCAT44(in_register_0000000c,w);
  if ((n & 1U) == 0) {
    secp256k1_ecmult_table_get_ge_storage_cold_4();
    r_00 = (secp256k1_gej *)r;
LAB_00120d40:
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_00120d45:
    secp256k1_ecmult_table_get_ge_storage_cold_2();
  }
  else {
    r_00 = (secp256k1_gej *)r;
    if (n < -7) goto LAB_00120d40;
    if (7 < n) goto LAB_00120d45;
    if (0 < n) {
      secp256k1_ge_from_storage(r,pre + (n - 1U >> 1));
      return;
    }
    pre = pre + ((uint)~n >> 1);
    secp256k1_ge_from_storage(r,pre);
    psVar1 = &r->y;
    r_00 = (secp256k1_gej *)psVar1;
    secp256k1_fe_verify(psVar1);
    unaff_RBX = r;
    if ((r->y).magnitude < 2) {
      uVar180 = (r->y).n[1];
      uVar175 = (r->y).n[2];
      uVar176 = (r->y).n[3];
      (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
      (r->y).n[1] = 0x3ffffffffffffc - uVar180;
      (r->y).n[2] = 0x3ffffffffffffc - uVar175;
      (r->y).n[3] = 0x3ffffffffffffc - uVar176;
      (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
      (r->y).magnitude = 2;
      (r->y).normalized = 0;
      secp256k1_fe_verify(psVar1);
      return;
    }
  }
  secp256k1_ecmult_table_get_ge_storage_cold_1();
  psStack_48 = unaff_RBX;
  secp256k1_ge_verify(a_00);
  secp256k1_fe_verify(&a->x);
  if (((secp256k1_gej *)pre)->infinity == 0) {
    if (a_00->infinity != 0) {
      memcpy(r_00,pre,0x98);
      return;
    }
    a_01 = (secp256k1_gej *)&sStack_b0;
    secp256k1_fe_mul((secp256k1_fe *)a_01,&((secp256k1_gej *)pre)->z,&a->x);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (8 < sStack_b0.magnitude) goto LAB_00122062;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = sStack_b0.n[0] * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = sStack_b0.n[3];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = sStack_b0.n[1] * 2;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = sStack_b0.n[2];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = sStack_b0.n[4];
    auVar101._8_8_ = 0;
    auVar101._0_8_ = sStack_b0.n[4];
    uVar185 = SUB168(auVar25 * auVar101,0);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar185 & 0xfffffffffffff;
    auVar23 = auVar24 * auVar100 + auVar23 * auVar99 + auVar26 * ZEXT816(0x1000003d10);
    uVar182 = auVar23._0_8_;
    auStack_1a0._144_8_ = uVar182 & 0xfffffffffffff;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar182 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar182 = sStack_b0.n[4] * 2;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = sStack_b0.n[0];
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar182;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = sStack_b0.n[1] * 2;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = sStack_b0.n[3];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = sStack_b0.n[2];
    auVar104._8_8_ = 0;
    auVar104._0_8_ = sStack_b0.n[2];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar185 >> 0x34 | SUB168(auVar25 * auVar101,8) << 0xc;
    auVar23 = auVar27 * auVar102 + auVar154 + auVar28 * auVar103 + auVar29 * auVar104 +
              auVar30 * ZEXT816(0x1000003d10);
    auStack_270._48_8_ = auVar23._0_8_;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = (ulong)auStack_270._48_8_ >> 0x34 | auVar23._8_8_ << 0xc;
    auStack_1a0._96_8_ = (auStack_270._48_8_ & 0xfffffffffffff) >> 0x30;
    auStack_270._48_8_ = auStack_270._48_8_ & 0xffffffffffff;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = sStack_b0.n[0];
    auVar105._8_8_ = 0;
    auVar105._0_8_ = sStack_b0.n[0];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = sStack_b0.n[1];
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar182;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = sStack_b0.n[2] * 2;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = sStack_b0.n[3];
    auVar23 = auVar32 * auVar106 + auVar155 + auVar33 * auVar107;
    uVar185 = auVar23._0_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar185 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = (uVar185 & 0xfffffffffffff) << 4 | auStack_1a0._96_8_;
    auVar23 = auVar31 * auVar105 + ZEXT816(0x1000003d1) * auVar108;
    uVar185 = auVar23._0_8_;
    auStack_1a0._48_8_ = uVar185 & 0xfffffffffffff;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar185 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = sStack_b0.n[0] * 2;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = sStack_b0.n[1];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = sStack_b0.n[2];
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar182;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = sStack_b0.n[3];
    auVar111._8_8_ = 0;
    auVar111._0_8_ = sStack_b0.n[3];
    auVar24 = auVar35 * auVar110 + auVar157 + auVar36 * auVar111;
    uVar185 = auVar24._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar185 & 0xfffffffffffff;
    auVar23 = auVar34 * auVar109 + auVar156 + auVar37 * ZEXT816(0x1000003d10);
    uVar186 = auVar23._0_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar185 >> 0x34 | auVar24._8_8_ << 0xc;
    auStack_1a0._56_8_ = uVar186 & 0xfffffffffffff;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar186 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = sStack_b0.n[0] * 2;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = sStack_b0.n[2];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = sStack_b0.n[1];
    auVar113._8_8_ = 0;
    auVar113._0_8_ = sStack_b0.n[1];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = sStack_b0.n[3];
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar182;
    auVar159 = auVar40 * auVar114 + auVar159;
    uVar182 = auVar159._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar182 & 0xfffffffffffff;
    auVar23 = auVar38 * auVar112 + auVar158 + auVar39 * auVar113 + auVar41 * ZEXT816(0x1000003d10);
    uVar185 = auVar23._0_8_;
    auStack_1a0._64_8_ = uVar185 & 0xfffffffffffff;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = (uVar185 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_1a0._144_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar182 >> 0x34 | auVar159._8_8_ << 0xc;
    auVar160 = auVar42 * ZEXT816(0x1000003d10) + auVar160;
    uVar182 = auVar160._0_8_;
    auStack_1a0._72_8_ = uVar182 & 0xfffffffffffff;
    auStack_1a0._80_8_ = (uVar182 >> 0x34 | auVar160._8_8_ << 0xc) + auStack_270._48_8_;
    auStack_1a0._88_4_ = 1;
    auStack_1a0._92_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
    auStack_1a0._144_8_ = (((secp256k1_gej *)pre)->x).n[0];
    uStack_108 = (((secp256k1_gej *)pre)->x).n[1];
    uStack_100 = (((secp256k1_gej *)pre)->x).n[2];
    uStack_f8 = (((secp256k1_gej *)pre)->x).n[3];
    uStack_f0 = (((secp256k1_gej *)pre)->x).n[4];
    uStack_e8._0_4_ = (((secp256k1_gej *)pre)->x).magnitude;
    uStack_e8._4_4_ = (((secp256k1_gej *)pre)->x).normalized;
    psVar1 = (secp256k1_fe *)(auStack_1a0 + 0x90);
    secp256k1_fe_verify(psVar1);
    uVar185 = (uStack_f0 >> 0x30) * 0x1000003d1 + auStack_1a0._144_8_;
    uVar182 = (uVar185 >> 0x34) + uStack_108;
    uVar188 = (uVar182 >> 0x34) + uStack_100;
    uVar186 = (uVar188 >> 0x34) + uStack_f8;
    uVar179 = uVar186 & 0xfffffffffffff;
    lVar189 = (uVar186 >> 0x34) + (uStack_f0 & 0xffffffffffff);
    uVar188 = uVar188 & 0xfffffffffffff;
    uVar182 = uVar182 & 0xfffffffffffff;
    uVar185 = uVar185 & 0xfffffffffffff;
    uStack_e8 = CONCAT44(uStack_e8._4_4_,1);
    auStack_1a0._144_8_ = uVar185;
    uStack_108 = uVar182;
    uStack_100 = uVar188;
    uStack_f8 = uVar179;
    uStack_f0 = lVar189;
    secp256k1_fe_verify(psVar1);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_270 + 0x30),&a_00->x,
                     (secp256k1_fe *)(auStack_1a0 + 0x30));
    auStack_1a0._96_8_ = (((secp256k1_gej *)pre)->y).n[0];
    auStack_1a0._104_8_ = (((secp256k1_gej *)pre)->y).n[1];
    auStack_1a0._112_8_ = (((secp256k1_gej *)pre)->y).n[2];
    auStack_1a0._120_8_ = (((secp256k1_gej *)pre)->y).n[3];
    auStack_1a0._128_8_ = (((secp256k1_gej *)pre)->y).n[4];
    auStack_1a0._136_4_ = (((secp256k1_gej *)pre)->y).magnitude;
    auStack_1a0._140_4_ = (((secp256k1_gej *)pre)->y).normalized;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x60));
    uVar186 = ((ulong)auStack_1a0._128_8_ >> 0x30) * 0x1000003d1 + auStack_1a0._96_8_;
    uVar184 = (uVar186 >> 0x34) + auStack_1a0._104_8_;
    uVar178 = (uVar184 >> 0x34) + auStack_1a0._112_8_;
    uVar181 = (uVar178 >> 0x34) + auStack_1a0._120_8_;
    uVar187 = uVar181 & 0xfffffffffffff;
    uVar180 = (uVar181 >> 0x34) + (auStack_1a0._128_8_ & 0xffffffffffff);
    uVar178 = uVar178 & 0xfffffffffffff;
    uVar184 = uVar184 & 0xfffffffffffff;
    uVar186 = uVar186 & 0xfffffffffffff;
    auStack_1a0._136_4_ = 1;
    auStack_1a0._96_8_ = uVar186;
    auStack_1a0._104_8_ = uVar184;
    auStack_1a0._112_8_ = uVar178;
    auStack_1a0._120_8_ = uVar187;
    auStack_1a0._128_8_ = uVar180;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x60));
    secp256k1_fe_mul((secp256k1_fe *)auStack_210,&a_00->y,(secp256k1_fe *)(auStack_1a0 + 0x30));
    secp256k1_fe_mul((secp256k1_fe *)auStack_210,(secp256k1_fe *)auStack_210,&sStack_b0);
    secp256k1_fe_verify(psVar1);
    uVar185 = 0x3ffffbfffff0bc - uVar185;
    uVar182 = 0x3ffffffffffffc - uVar182;
    uVar188 = 0x3ffffffffffffc - uVar188;
    uVar179 = 0x3ffffffffffffc - uVar179;
    uVar181 = 0x3fffffffffffc - lVar189;
    auStack_1a0._40_8_ = 2;
    auStack_1a0._0_8_ = uVar185;
    auStack_1a0._8_8_ = uVar182;
    auStack_1a0._16_8_ = uVar188;
    auStack_1a0._24_8_ = uVar179;
    auStack_1a0._32_8_ = uVar181;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    a_01 = (secp256k1_gej *)(auStack_270 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (0x1e < iStack_218) goto LAB_00122067;
    uVar185 = uVar185 + auStack_270._48_8_;
    uVar182 = uVar182 + uStack_238;
    uVar188 = uVar188 + uStack_230;
    uVar179 = uVar179 + uStack_228;
    uVar181 = uVar181 + uStack_220;
    auStack_1a0._44_4_ = 0;
    auStack_1a0._40_4_ = iStack_218 + 2;
    auStack_1a0._0_8_ = uVar185;
    auStack_1a0._8_8_ = uVar182;
    auStack_1a0._16_8_ = uVar188;
    auStack_1a0._24_8_ = uVar179;
    auStack_1a0._32_8_ = uVar181;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    a_01 = (secp256k1_gej *)auStack_210;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (1 < (int)auStack_210._40_4_) goto LAB_0012206c;
    sStack_e0.magnitude = 2;
    sStack_e0.normalized = 0;
    sStack_e0.n[0] = 0x3ffffbfffff0bc - auStack_210._0_8_;
    sStack_e0.n[1] = 0x3ffffffffffffc - auStack_210._8_8_;
    sStack_e0.n[2] = 0x3ffffffffffffc - auStack_210._16_8_;
    sStack_e0.n[3] = 0x3ffffffffffffc - auStack_210._24_8_;
    sStack_e0.n[4] = 0x3fffffffffffc - auStack_210._32_8_;
    secp256k1_fe_verify(&sStack_e0);
    secp256k1_fe_verify(&sStack_e0);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x60));
    uVar186 = (0x3ffffbfffff0bc - auStack_210._0_8_) + uVar186;
    uVar184 = (0x3ffffffffffffc - auStack_210._8_8_) + uVar184;
    uVar178 = (0x3ffffffffffffc - auStack_210._16_8_) + uVar178;
    uVar187 = (0x3ffffffffffffc - auStack_210._24_8_) + uVar187;
    uVar183 = (0x3fffffffffffc - auStack_210._32_8_) + uVar180;
    sStack_e0.magnitude = 3;
    sStack_e0.normalized = 0;
    sStack_e0.n[0] = uVar186;
    sStack_e0.n[1] = uVar184;
    sStack_e0.n[2] = uVar178;
    sStack_e0.n[3] = uVar187;
    sStack_e0.n[4] = uVar183;
    secp256k1_fe_verify(&sStack_e0);
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    uVar185 = (uVar181 >> 0x30) * 0x1000003d1 + uVar185;
    if (((uVar185 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar185 & 0xfffffffffffff) == 0)) {
      uVar182 = uVar182 + (uVar185 >> 0x34);
      uVar188 = (uVar182 >> 0x34) + uVar188;
      uVar179 = (uVar188 >> 0x34) + uVar179;
      uVar181 = (uVar179 >> 0x34) + (uVar181 & 0xffffffffffff);
      if ((((uVar182 | uVar185 | uVar188 | uVar179) & 0xfffffffffffff) == 0 && uVar181 == 0) ||
         ((uVar185 + 0x1000003d0 & uVar182 & uVar188 & uVar179 & (uVar181 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify(&sStack_e0);
        uVar186 = (uVar183 >> 0x30) * 0x1000003d1 + uVar186;
        if (((uVar186 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar186 & 0xfffffffffffff) == 0))
        {
          uVar184 = uVar184 + (uVar186 >> 0x34);
          uVar178 = (uVar184 >> 0x34) + uVar178;
          uVar187 = (uVar178 >> 0x34) + uVar187;
          uVar182 = (uVar187 >> 0x34) + (uVar183 & 0xffffffffffff);
          if ((((uVar184 | uVar186 | uVar178 | uVar187) & 0xfffffffffffff) == 0 && uVar182 == 0) ||
             ((uVar186 + 0x1000003d0 & uVar184 & uVar178 & uVar187 & (uVar182 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var(r_00,(secp256k1_gej *)pre,(secp256k1_fe *)0x0);
            return;
          }
        }
        secp256k1_gej_set_infinity(r_00);
        return;
      }
    }
    r_00->infinity = 0;
    a_01 = (secp256k1_gej *)auStack_1a0;
    secp256k1_fe_mul(&r_00->z,&((secp256k1_gej *)pre)->z,(secp256k1_fe *)a_01);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (8 < (int)auStack_1a0._40_4_) goto LAB_00122071;
    a_01 = (secp256k1_gej *)&stack0xffffffffffffff80;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auStack_1a0._0_8_ * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = auStack_1a0._24_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auStack_1a0._8_8_ * 2;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = auStack_1a0._16_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = auStack_1a0._32_8_;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = auStack_1a0._32_8_;
    uVar185 = SUB168(auVar45 * auVar117,0);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar185 & 0xfffffffffffff;
    auVar23 = auVar44 * auVar116 + auVar43 * auVar115 + auVar46 * ZEXT816(0x1000003d10);
    uVar182 = auVar23._0_8_;
    auStack_270._0_8_ = uVar182 & 0xfffffffffffff;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar182 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar182 = auStack_1a0._32_8_ * 2;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = auStack_1a0._0_8_;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar182;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auStack_1a0._8_8_ * 2;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = auStack_1a0._24_8_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = auStack_1a0._16_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = auStack_1a0._16_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar185 >> 0x34 | SUB168(auVar45 * auVar117,8) << 0xc;
    auVar23 = auVar47 * auVar118 + auVar161 + auVar48 * auVar119 + auVar49 * auVar120 +
              auVar50 * ZEXT816(0x1000003d10);
    uVar185 = auVar23._0_8_;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar185 >> 0x34 | auVar23._8_8_ << 0xc;
    auStack_210._48_8_ = uVar185 & 0xffffffffffff;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auStack_1a0._0_8_;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auStack_1a0._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auStack_1a0._8_8_;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar182;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auStack_1a0._16_8_ * 2;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = auStack_1a0._24_8_;
    auVar23 = auVar52 * auVar122 + auVar162 + auVar53 * auVar123;
    uVar186 = auVar23._0_8_;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar186 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = (uVar186 & 0xfffffffffffff) << 4 | (uVar185 & 0xfffffffffffff) >> 0x30;
    auVar23 = auVar51 * auVar121 + ZEXT816(0x1000003d1) * auVar124;
    uVar185 = auVar23._0_8_;
    uStack_80 = uVar185 & 0xfffffffffffff;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar185 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auStack_1a0._0_8_ * 2;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auStack_1a0._8_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = auStack_1a0._16_8_;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar182;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auStack_1a0._24_8_;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = auStack_1a0._24_8_;
    auVar24 = auVar55 * auVar126 + auVar164 + auVar56 * auVar127;
    uVar185 = auVar24._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar185 & 0xfffffffffffff;
    auVar23 = auVar54 * auVar125 + auVar163 + auVar57 * ZEXT816(0x1000003d10);
    uVar186 = auVar23._0_8_;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar185 >> 0x34 | auVar24._8_8_ << 0xc;
    uStack_78 = uVar186 & 0xfffffffffffff;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar186 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auStack_1a0._0_8_ * 2;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = auStack_1a0._16_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = auStack_1a0._8_8_;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = auStack_1a0._8_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = auStack_1a0._24_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar182;
    auVar166 = auVar60 * auVar130 + auVar166;
    uVar182 = auVar166._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar182 & 0xfffffffffffff;
    auVar23 = auVar58 * auVar128 + auVar165 + auVar59 * auVar129 + auVar61 * ZEXT816(0x1000003d10);
    uVar185 = auVar23._0_8_;
    uStack_70 = uVar185 & 0xfffffffffffff;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = (uVar185 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_270._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar182 >> 0x34 | auVar166._8_8_ << 0xc;
    auVar167 = auVar62 * ZEXT816(0x1000003d10) + auVar167;
    uVar182 = auVar167._0_8_;
    uStack_68 = uVar182 & 0xfffffffffffff;
    uStack_60 = (uVar182 >> 0x34 | auVar167._8_8_ << 0xc) + auStack_210._48_8_;
    iStack_58 = 1;
    iStack_54 = 0;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (1 < iStack_58) goto LAB_00122076;
    uStack_80 = 0x3ffffbfffff0bc - uStack_80;
    uStack_78 = 0x3ffffffffffffc - uStack_78;
    uStack_70 = 0x3ffffffffffffc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    uStack_60 = 0x3fffffffffffc - uStack_60;
    iStack_58 = 2;
    iStack_54 = 0;
    secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff80);
    a_01 = (secp256k1_gej *)auStack_270;
    secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)&stack0xffffffffffffff80,
                     (secp256k1_fe *)auStack_1a0);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_210 + 0x30),(secp256k1_fe *)(auStack_1a0 + 0x90),
                     (secp256k1_fe *)&stack0xffffffffffffff80);
    secp256k1_fe_verify(&sStack_e0);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = sStack_e0.n[0] * 2;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = sStack_e0.n[3];
    auVar64._8_8_ = 0;
    auVar64._0_8_ = sStack_e0.n[1] * 2;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = sStack_e0.n[2];
    auVar65._8_8_ = 0;
    auVar65._0_8_ = sStack_e0.n[4];
    auVar133._8_8_ = 0;
    auVar133._0_8_ = sStack_e0.n[4];
    uVar185 = SUB168(auVar65 * auVar133,0);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar185 & 0xfffffffffffff;
    auVar23 = auVar64 * auVar132 + auVar63 * auVar131 + auVar66 * ZEXT816(0x1000003d10);
    uVar186 = auVar23._0_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar186 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar182 = sStack_e0.n[4] * 2;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = sStack_e0.n[0];
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar182;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = sStack_e0.n[1] * 2;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = sStack_e0.n[3];
    auVar69._8_8_ = 0;
    auVar69._0_8_ = sStack_e0.n[2];
    auVar136._8_8_ = 0;
    auVar136._0_8_ = sStack_e0.n[2];
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar185 >> 0x34 | SUB168(auVar65 * auVar133,8) << 0xc;
    auVar23 = auVar67 * auVar134 + auVar168 + auVar68 * auVar135 + auVar69 * auVar136 +
              auVar70 * ZEXT816(0x1000003d10);
    uStack_1a8 = auVar23._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uStack_1a8 >> 0x34 | auVar23._8_8_ << 0xc;
    uStack_1b0 = (uStack_1a8 & 0xfffffffffffff) >> 0x30;
    uStack_1a8 = uStack_1a8 & 0xffffffffffff;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = sStack_e0.n[0];
    auVar137._8_8_ = 0;
    auVar137._0_8_ = sStack_e0.n[0];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = sStack_e0.n[1];
    auVar138._8_8_ = 0;
    auVar138._0_8_ = uVar182;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = sStack_e0.n[2] * 2;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = sStack_e0.n[3];
    auVar23 = auVar72 * auVar138 + auVar169 + auVar73 * auVar139;
    uVar185 = auVar23._0_8_;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar185 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = (uVar185 & 0xfffffffffffff) << 4 | uStack_1b0;
    auVar23 = auVar71 * auVar137 + ZEXT816(0x1000003d1) * auVar140;
    uVar185 = auVar23._0_8_;
    (r_00->x).n[0] = uVar185 & 0xfffffffffffff;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar185 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = sStack_e0.n[0] * 2;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = sStack_e0.n[1];
    auVar75._8_8_ = 0;
    auVar75._0_8_ = sStack_e0.n[2];
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar182;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = sStack_e0.n[3];
    auVar143._8_8_ = 0;
    auVar143._0_8_ = sStack_e0.n[3];
    auVar24 = auVar75 * auVar142 + auVar171 + auVar76 * auVar143;
    uVar185 = auVar24._0_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar185 & 0xfffffffffffff;
    auVar23 = auVar74 * auVar141 + auVar170 + auVar77 * ZEXT816(0x1000003d10);
    uVar179 = auVar23._0_8_;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar185 >> 0x34 | auVar24._8_8_ << 0xc;
    (r_00->x).n[1] = uVar179 & 0xfffffffffffff;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar179 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = sStack_e0.n[0] * 2;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = sStack_e0.n[2];
    auVar79._8_8_ = 0;
    auVar79._0_8_ = sStack_e0.n[1];
    auVar145._8_8_ = 0;
    auVar145._0_8_ = sStack_e0.n[1];
    auVar80._8_8_ = 0;
    auVar80._0_8_ = sStack_e0.n[3];
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar182;
    auVar173 = auVar80 * auVar146 + auVar173;
    uVar182 = auVar173._0_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar182 & 0xfffffffffffff;
    auVar23 = auVar78 * auVar144 + auVar172 + auVar79 * auVar145 + auVar81 * ZEXT816(0x1000003d10);
    uVar185 = auVar23._0_8_;
    (r_00->x).n[2] = uVar185 & 0xfffffffffffff;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = (uVar185 >> 0x34 | auVar23._8_8_ << 0xc) + (uVar186 & 0xfffffffffffff);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar182 >> 0x34 | auVar173._8_8_ << 0xc;
    auVar174 = auVar82 * ZEXT816(0x1000003d10) + auVar174;
    uVar182 = auVar174._0_8_;
    (r_00->x).n[3] = uVar182 & 0xfffffffffffff;
    (r_00->x).n[4] = (uVar182 >> 0x34 | auVar174._8_8_ << 0xc) + uStack_1a8;
    (r_00->x).magnitude = 1;
    (r_00->x).normalized = 0;
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar177 = auStack_270._40_4_ + (r_00->x).magnitude;
    if (0x20 < iVar177) goto LAB_0012207b;
    uVar180 = (r_00->x).n[1];
    uVar175 = (r_00->x).n[2];
    uVar176 = (r_00->x).n[3];
    (r_00->x).n[0] = (r_00->x).n[0] + auStack_270._0_8_;
    (r_00->x).n[1] = uVar180 + auStack_270._8_8_;
    (r_00->x).n[2] = uVar175 + auStack_270._16_8_;
    (r_00->x).n[3] = uVar176 + auStack_270._24_8_;
    puVar2 = (r_00->x).n + 4;
    *puVar2 = *puVar2 + auStack_270._32_8_;
    (r_00->x).magnitude = iVar177;
    (r_00->x).normalized = 0;
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify(&r_00->x);
    a_01 = (secp256k1_gej *)(auStack_210 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar177 = iStack_1b8 + (r_00->x).magnitude;
    if (0x20 < iVar177) goto LAB_00122080;
    uVar180 = (r_00->x).n[1];
    uVar175 = (r_00->x).n[2];
    uVar176 = (r_00->x).n[3];
    a_01 = (secp256k1_gej *)(auStack_210 + 0x30);
    (r_00->x).n[0] = (r_00->x).n[0] + auStack_210._48_8_;
    (r_00->x).n[1] = uVar180 + uStack_1d8;
    (r_00->x).n[2] = uVar175 + uStack_1d0;
    (r_00->x).n[3] = uVar176 + uStack_1c8;
    puVar2 = (r_00->x).n + 4;
    *puVar2 = *puVar2 + uStack_1c0;
    (r_00->x).magnitude = iVar177;
    (r_00->x).normalized = 0;
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar177 = iStack_1b8 + (r_00->x).magnitude;
    if (0x20 < iVar177) goto LAB_00122085;
    uVar180 = (r_00->x).n[1];
    uVar175 = (r_00->x).n[2];
    uVar176 = (r_00->x).n[3];
    (r_00->x).n[0] = (r_00->x).n[0] + auStack_210._48_8_;
    (r_00->x).n[1] = uVar180 + uStack_1d8;
    (r_00->x).n[2] = uVar175 + uStack_1d0;
    (r_00->x).n[3] = uVar176 + uStack_1c8;
    puVar2 = (r_00->x).n + 4;
    *puVar2 = *puVar2 + uStack_1c0;
    (r_00->x).magnitude = iVar177;
    (r_00->x).normalized = 0;
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_210 + 0x30));
    a_01 = r_00;
    secp256k1_fe_verify(&r_00->x);
    iVar177 = (r_00->x).magnitude + iStack_1b8;
    if (iVar177 < 0x21) {
      auStack_210._48_8_ = (r_00->x).n[0] + auStack_210._48_8_;
      uStack_1d8 = (r_00->x).n[1] + uStack_1d8;
      uStack_1d0 = (r_00->x).n[2] + uStack_1d0;
      uStack_1c8 = (r_00->x).n[3] + uStack_1c8;
      uStack_1c0 = uStack_1c0 + (r_00->x).n[4];
      iStack_1b4 = 0;
      iStack_1b8 = iVar177;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_210 + 0x30));
      psVar1 = &r_00->y;
      secp256k1_fe_mul(psVar1,(secp256k1_fe *)(auStack_210 + 0x30),&sStack_e0);
      a_01 = (secp256k1_gej *)auStack_270;
      secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,
                       (secp256k1_fe *)(auStack_1a0 + 0x60));
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      iVar177 = auStack_270._40_4_ + (r_00->y).magnitude;
      if (iVar177 < 0x21) {
        uVar180 = (r_00->y).n[1];
        uVar175 = (r_00->y).n[2];
        uVar176 = (r_00->y).n[3];
        (r_00->y).n[0] = (r_00->y).n[0] + auStack_270._0_8_;
        (r_00->y).n[1] = uVar180 + auStack_270._8_8_;
        (r_00->y).n[2] = uVar175 + auStack_270._16_8_;
        (r_00->y).n[3] = uVar176 + auStack_270._24_8_;
        puVar2 = (r_00->y).n + 4;
        *puVar2 = *puVar2 + auStack_270._32_8_;
        (r_00->y).magnitude = iVar177;
        (r_00->y).normalized = 0;
        secp256k1_fe_verify(psVar1);
        secp256k1_gej_verify(r_00);
        return;
      }
      goto LAB_0012208f;
    }
  }
  else {
    r_00->infinity = a_00->infinity;
    a_01 = a;
    secp256k1_fe_verify(&a->x);
    if ((a->x).magnitude < 9) {
      uVar182 = (a->x).n[0];
      uVar185 = (a->x).n[1];
      uVar186 = (a->x).n[2];
      uVar179 = (a->x).n[3];
      uVar188 = (a->x).n[4];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar182 * 2;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar179;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar185 * 2;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar186;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar188;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar188;
      uVar178 = SUB168(auVar5 * auVar85,0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar178 & 0xfffffffffffff;
      auVar23 = auVar4 * auVar84 + auVar3 * auVar83 + auVar6 * ZEXT816(0x1000003d10);
      uVar181 = auVar23._0_8_;
      auStack_1a0._48_8_ = uVar181 & 0xfffffffffffff;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar181 >> 0x34 | auVar23._8_8_ << 0xc;
      uVar188 = uVar188 * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar182;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar188;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar185 * 2;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar179;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar186;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar186;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar178 >> 0x34 | SUB168(auVar5 * auVar85,8) << 0xc;
      auVar23 = auVar7 * auVar86 + auVar147 + auVar8 * auVar87 + auVar9 * auVar88 +
                auVar10 * ZEXT816(0x1000003d10);
      uVar178 = auVar23._0_8_;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar178 >> 0x34 | auVar23._8_8_ << 0xc;
      auStack_270._48_8_ = (uVar178 & 0xfffffffffffff) >> 0x30;
      auStack_1a0._144_8_ = uVar178 & 0xffffffffffff;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar182;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar182;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar185;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar188;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar186 * 2;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar179;
      auVar23 = auVar12 * auVar90 + auVar148 + auVar13 * auVar91;
      uVar178 = auVar23._0_8_;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar178 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = (uVar178 & 0xfffffffffffff) << 4 | auStack_270._48_8_;
      auVar23 = auVar11 * auVar89 + ZEXT816(0x1000003d1) * auVar92;
      uVar178 = auVar23._0_8_;
      sStack_b0.n[0] = uVar178 & 0xfffffffffffff;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar178 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar182 * 2;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar185;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar186;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar188;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar179;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar179;
      auVar24 = auVar15 * auVar94 + auVar150 + auVar16 * auVar95;
      uVar178 = auVar24._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar178 & 0xfffffffffffff;
      auVar23 = auVar14 * auVar93 + auVar149 + auVar17 * ZEXT816(0x1000003d10);
      uVar181 = auVar23._0_8_;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = uVar178 >> 0x34 | auVar24._8_8_ << 0xc;
      sStack_b0.n[1] = uVar181 & 0xfffffffffffff;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar181 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar182 * 2;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar186;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar185;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar185;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar179;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar188;
      auVar152 = auVar20 * auVar98 + auVar152;
      uVar182 = auVar152._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar182 & 0xfffffffffffff;
      auVar23 = auVar18 * auVar96 + auVar151 + auVar19 * auVar97 + auVar21 * ZEXT816(0x1000003d10);
      uVar185 = auVar23._0_8_;
      sStack_b0.n[2] = uVar185 & 0xfffffffffffff;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = (uVar185 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_1a0._48_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar182 >> 0x34 | auVar152._8_8_ << 0xc;
      auVar153 = auVar22 * ZEXT816(0x1000003d10) + auVar153;
      uVar182 = auVar153._0_8_;
      sStack_b0.n[3] = uVar182 & 0xfffffffffffff;
      sStack_b0.n[4] = (uVar182 >> 0x34 | auVar153._8_8_ << 0xc) + auStack_1a0._144_8_;
      sStack_b0.magnitude = 1;
      sStack_b0.normalized = 0;
      secp256k1_fe_verify(&sStack_b0);
      secp256k1_fe_mul((secp256k1_fe *)(auStack_1a0 + 0x30),&sStack_b0,&a->x);
      secp256k1_fe_mul(&r_00->x,&a_00->x,&sStack_b0);
      secp256k1_fe_mul(&r_00->y,&a_00->y,(secp256k1_fe *)(auStack_1a0 + 0x30));
      (r_00->z).n[0] = 1;
      (r_00->z).n[1] = 0;
      (r_00->z).n[2] = 0;
      (r_00->z).n[3] = 0;
      (r_00->z).n[4] = 0;
      (r_00->z).magnitude = 1;
      (r_00->z).normalized = 1;
      secp256k1_fe_verify(&r_00->z);
      return;
    }
    secp256k1_gej_add_zinv_var_cold_1();
LAB_00122062:
    secp256k1_gej_add_zinv_var_cold_11();
LAB_00122067:
    secp256k1_gej_add_zinv_var_cold_10();
LAB_0012206c:
    secp256k1_gej_add_zinv_var_cold_9();
LAB_00122071:
    secp256k1_gej_add_zinv_var_cold_8();
LAB_00122076:
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0012207b:
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00122080:
    secp256k1_gej_add_zinv_var_cold_5();
LAB_00122085:
    secp256k1_gej_add_zinv_var_cold_4();
  }
  secp256k1_gej_add_zinv_var_cold_3();
LAB_0012208f:
  secp256k1_gej_add_zinv_var_cold_2();
  *(undefined4 *)(a_01->z).n = 1;
  (a_01->x).magnitude = 0;
  (a_01->x).normalized = 1;
  (a_01->x).n[0] = 0;
  (a_01->x).n[1] = 0;
  (a_01->x).n[2] = 0;
  (a_01->x).n[3] = 0;
  (a_01->x).n[4] = 0;
  secp256k1_fe_verify(&a_01->x);
  (a_01->y).magnitude = 0;
  (a_01->y).normalized = 1;
  (a_01->y).n[0] = 0;
  (a_01->y).n[1] = 0;
  (a_01->y).n[2] = 0;
  (a_01->y).n[3] = 0;
  (a_01->y).n[4] = 0;
  secp256k1_fe_verify(&a_01->y);
  secp256k1_ge_verify((secp256k1_ge *)a_01);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}